

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>,float>
               (View<float,_false,_std::allocator<unsigned_long>_> *v,
               BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
               *expression)

{
  CoordinateOrder CVar1;
  pointer pfVar2;
  unsigned_long uVar3;
  size_t sVar4;
  size_t sVar5;
  CoordinateOrder *pCVar6;
  size_t j_1;
  long lVar7;
  size_t j_2;
  size_t j;
  ulong uVar8;
  bool bVar9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> coordinate;
  Marray<float,_std::allocator<unsigned_long>_> m;
  allocator_type local_91;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_90;
  undefined1 local_78 [16];
  ExpressionIterator local_68 [2];
  
  if ((v->geometry_).size_ == 0) {
    bVar9 = false;
  }
  else {
    bVar9 = (expression->e_->geometry_).size_ != 0;
  }
  Assert<bool>(bVar9);
  sVar4 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
          ::dimension(expression);
  sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
  Assert<bool>(sVar4 == sVar5);
  sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
  if (sVar4 == 0) {
    if ((v->geometry_).size_ == 1) {
      bVar9 = (expression->e_->geometry_).size_ == 1;
    }
    else {
      bVar9 = false;
    }
    Assert<bool>(bVar9);
  }
  else {
    for (uVar8 = 0; sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v),
        uVar8 < sVar4; uVar8 = uVar8 + 1) {
      sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,uVar8);
      sVar5 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
              ::shape(expression,uVar8);
      Assert<bool>(sVar4 == sVar5);
    }
  }
  bVar9 = BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>
          ::overlaps<float,false,std::allocator<unsigned_long>>
                    ((BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>
                      *)expression,v);
  if (bVar9) {
    Marray<float,std::allocator<unsigned_long>>::
    Marray<andres::BinaryViewExpressionScalarFirst<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Minus<float,float,float>>,float>
              ((Marray<float,std::allocator<unsigned_long>> *)local_78,
               (ViewExpression<andres::BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>,_float>
                *)expression,(allocator_type *)&local_90);
    operate<andres::marray_detail::Assign<float,float>,float,float,false,std::allocator<unsigned_long>>
              (v,local_78);
    Marray<float,_std::allocator<unsigned_long>_>::~Marray
              ((Marray<float,_std::allocator<unsigned_long>_> *)local_78);
  }
  else {
    sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar4 != 0) {
      bVar9 = View<float,_false,_std::allocator<unsigned_long>_>::isSimple(v);
      if ((bVar9) &&
         (bVar9 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                  ::isSimple(expression), bVar9)) {
        View<float,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
        CVar1 = (v->geometry_).coordinateOrder_;
        pCVar6 = BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
                 ::coordinateOrder(expression);
        if (CVar1 == *pCVar6) {
          pfVar2 = v->data_;
          sVar4 = (v->geometry_).size_;
          for (sVar5 = 0; sVar4 != sVar5; sVar5 = sVar5 + 1) {
            pfVar2[sVar5] = expression->scalar_ - expression->e_->data_[sVar5];
          }
          return;
        }
      }
      BinaryViewExpressionScalarFirst<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Minus<float,_float,_float>_>
      ::ExpressionIterator::ExpressionIterator((ExpressionIterator *)local_78,expression);
      sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_90,sVar4,&local_91)
      ;
      sVar4 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v);
      lVar7 = 0;
      do {
        v->data_[lVar7] = *(float *)local_78._8_8_ - local_68[0].data_[local_68[0].offset_];
        for (uVar8 = 0; sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::dimension(v),
            uVar8 < sVar5; uVar8 = uVar8 + 1) {
          uVar3 = local_90._M_impl.super__Vector_impl_data._M_start[uVar8];
          sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::shape(v,uVar8);
          if (uVar3 + 1 != sVar5) {
            sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,uVar8);
            ViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float>::
            ExpressionIterator::incrementCoordinate(local_68,uVar8);
            lVar7 = lVar7 + sVar5;
            local_90._M_impl.super__Vector_impl_data._M_start[uVar8] =
                 local_90._M_impl.super__Vector_impl_data._M_start[uVar8] + 1;
            break;
          }
          if (sVar4 - 1 == uVar8) {
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&local_90);
            return;
          }
          uVar3 = local_90._M_impl.super__Vector_impl_data._M_start[uVar8];
          sVar5 = View<float,_false,_std::allocator<unsigned_long>_>::strides(v,uVar8);
          ViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float>::
          ExpressionIterator::resetCoordinate(local_68,uVar8);
          lVar7 = lVar7 - sVar5 * uVar3;
          local_90._M_impl.super__Vector_impl_data._M_start[uVar8] = 0;
        }
      } while( true );
    }
    *v->data_ = expression->scalar_ - *expression->e_->data_;
  }
  return;
}

Assistant:

inline void operate
(
    View<T1, false, A>& v, 
    const ViewExpression<E, T2>& expression, 
    Functor f
)
{
    const E& e = expression; // cast
    if(!MARRAY_NO_DEBUG) {
        Assert(v.size() != 0 && e.size() != 0);
        Assert(e.dimension() == v.dimension());
        if(v.dimension() == 0) {
            Assert(v.size() == 1 && e.size() == 1);
        }
        else {
            for(std::size_t j=0; j<v.dimension(); ++j) {
                Assert(v.shape(j) == e.shape(j));
            }
        }
    }
    if(e.overlaps(v)) {
        Marray<T1, A> m(e); // temporary copy
        operate(v, m, f);
    }
    else if(v.dimension() == 0) {
        f(v[0], e[0]);
    }
    else if(v.isSimple() && e.isSimple() 
    && v.coordinateOrder() == e.coordinateOrder()) {
        for(std::size_t j=0; j<v.size(); ++j) {
            f(v[j], e[j]);
        }
    }
    else {
        // loop unrolling does not improve performance here
        typename E::ExpressionIterator itE(e);
        std::size_t offsetV = 0;
        std::vector<std::size_t> coordinate(v.dimension());
        std::size_t maxDimension = v.dimension() - 1;
        for(;;) {
            f(v[offsetV], *itE);
            for(std::size_t j=0; j<v.dimension(); ++j) {
                if(coordinate[j]+1 == v.shape(j)) {
                    if(j == maxDimension) {
                        return;
                    }
                    else {
                        offsetV -= coordinate[j] * v.strides(j);
                        itE.resetCoordinate(j);
                        coordinate[j] = 0;
                    }
                }
                else {
                    offsetV += v.strides(j);
                    itE.incrementCoordinate(j);
                    ++coordinate[j];
                    break;
                }
            }
        }
    }
}